

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_conversions1.cpp
# Opt level: O0

void __thiscall
UnitDefinitions_unusualTemperature_Test::UnitDefinitions_unusualTemperature_Test
          (UnitDefinitions_unusualTemperature_Test *this)

{
  UnitDefinitions_unusualTemperature_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__UnitDefinitions_unusualTemperature_Test_0022d0e8;
  return;
}

Assistant:

TEST(UnitDefinitions, unusualTemperature)
{
    using namespace units;
    precise_unit kC = precise::kilo * precise::temperature::degC;
    EXPECT_NEAR(convert(0.1, kC, precise::temperature::degF), 212.0, 0.1);
    EXPECT_NEAR(convert(212, precise::temperature::degF, kC), 0.1, 0.0001);

    EXPECT_NEAR(
        convert(3.0, unit_from_string("gas mark"), precise::temperature::degF),
        325.0,
        1.0);
}